

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::RemoveUnusedInterfaceVariablesContext
          (RemoveUnusedInterfaceVariablesContext *this,RemoveUnusedInterfaceVariablesPass *parent,
          Instruction *entry)

{
  _Bind<bool_(spvtools::opt::RemoveUnusedInterfaceVariablesContext::*(spvtools::opt::RemoveUnusedInterfaceVariablesContext_*,_std::_Placeholder<1>))(spvtools::opt::Function_*)>
  local_18;
  
  this->parent_ = parent;
  this->entry_ = entry;
  (this->used_variables_)._M_h._M_buckets = &(this->used_variables_)._M_h._M_single_bucket;
  (this->used_variables_)._M_h._M_bucket_count = 1;
  (this->used_variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used_variables_)._M_h._M_element_count = 0;
  (this->used_variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used_variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used_variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->operands_to_add_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operands_to_add_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands_to_add_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_f = (offset_in_RemoveUnusedInterfaceVariablesContext_to_subr)processFunction;
  local_18._8_8_ = 0;
  local_18._M_bound_args.
  super__Tuple_impl<0UL,_spvtools::opt::RemoveUnusedInterfaceVariablesContext_*,_std::_Placeholder<1>_>
  .super__Head_base<0UL,_spvtools::opt::RemoveUnusedInterfaceVariablesContext_*,_false>._M_head_impl
       = (_Tuple_impl<0UL,_spvtools::opt::RemoveUnusedInterfaceVariablesContext_*,_std::_Placeholder<1>_>
          )(_Tuple_impl<0UL,_spvtools::opt::RemoveUnusedInterfaceVariablesContext_*,_std::_Placeholder<1>_>
            )this;
  std::function<bool(spvtools::opt::Function*)>::
  function<std::_Bind<bool(spvtools::opt::RemoveUnusedInterfaceVariablesContext::*(spvtools::opt::RemoveUnusedInterfaceVariablesContext*,std::_Placeholder<1>))(spvtools::opt::Function*)>,void>
            ((function<bool(spvtools::opt::Function*)> *)&this->pfn_,&local_18);
  return;
}

Assistant:

RemoveUnusedInterfaceVariablesContext(
      RemoveUnusedInterfaceVariablesPass& parent, Instruction& entry)
      : parent_(parent), entry_(entry) {}